

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata_impl.h
# Opt level: O0

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_>
::reset(QExplicitlySharedDataPointerV2<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_>
        *this,QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
              *t)

{
  bool bVar1;
  QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
  *pQVar2;
  QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
  *in_RSI;
  totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
  *in_RDI;
  
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
                      *)0x9fc121);
  if (bVar1) {
    Qt::
    totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
                  *)0x9fc131);
    bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x9fc139);
    if ((!bVar1) &&
       (pQVar2 = Qt::
                 totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
                 ::get(in_RDI),
       pQVar2 != (QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
                  *)0x0)) {
      QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
      ::~QMapData((QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>
                   *)0x9fc15c);
      operator_delete(pQVar2,0x38);
    }
  }
  Qt::
  totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
  ::reset(in_RDI,in_RSI);
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
                      *)0x9fc186);
  if (bVar1) {
    Qt::
    totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
    ::operator->((totally_ordered_wrapper<QMapData<std::map<Qt::MouseButton,_QPoint,_std::less<Qt::MouseButton>,_std::allocator<std::pair<const_Qt::MouseButton,_QPoint>_>_>_>_*>
                  *)0x9fc196);
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x9fc19e);
  }
  return;
}

Assistant:

void reset(T *t = nullptr) noexcept
    {
        if (d && !d->ref.deref())
            delete d.get();
        d.reset(t);
        if (d)
            d->ref.ref();
    }